

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O2

Vector<int,_std::allocator<int>_> * __thiscall
amrex::TagBox::tags(Vector<int,_std::allocator<int>_> *__return_storage_ptr__,TagBox *this)

{
  pointer piVar1;
  pointer piVar2;
  size_type __n;
  char *pcVar3;
  int i;
  long lVar4;
  allocator_type local_1d;
  value_type_conflict local_1c;
  
  __n = Box::numPts(&(this->super_BaseFab<char>).domain);
  local_1c = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&__return_storage_ptr__->super_vector<int,_std::allocator<int>_>,__n,&local_1c,
             &local_1d);
  pcVar3 = BaseFab<char>::dataPtr(&this->super_BaseFab<char>,0);
  piVar1 = (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  piVar2 = (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  for (lVar4 = 0; lVar4 < (long)piVar2 - (long)piVar1 >> 2; lVar4 = lVar4 + 1) {
    if (pcVar3[lVar4] != '\0') {
      piVar1[lVar4] = (int)pcVar3[lVar4];
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<int>
TagBox::tags () const noexcept
{
    Vector<int> ar(domain.numPts(), TagBox::CLEAR);

    const TagType* cptr = dataPtr();
    int*           iptr = ar.dataPtr();

    for (int i = 0; i < ar.size(); i++, cptr++, iptr++)
    {
        if (*cptr)
            *iptr = *cptr;
    }

    return ar;
}